

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O1

void __thiscall
ConvertAddrCommand::execute(ConvertAddrCommand *this,CmdParams *params,CmdContext *context)

{
  code cVar1;
  int iVar2;
  Executable *pEVar3;
  offset_t oVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  long *plVar6;
  addr_type type;
  addr_type type_00;
  long lVar7;
  char *pcVar8;
  string local_68;
  string local_48;
  
  pEVar3 = cmd_util::getExeFromContext(context);
  oVar4 = cmd_util::readOffset(this->addrFrom);
  iVar2 = (*(pEVar3->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x17])
                    (pEVar3,oVar4,(ulong)this->addrFrom,(ulong)this->addrTo);
  if (CONCAT44(extraout_var,iVar2) == -1) {
    plVar6 = &std::cout;
    pcVar8 = "[WARNING] This address cannot be mapped";
    lVar7 = 0x27;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    cmd_util::addrTypeToStr_abi_cxx11_(&local_48,(cmd_util *)(ulong)this->addrFrom,type);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\t->\t",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
    cmd_util::addrTypeToStr_abi_cxx11_(&local_68,(cmd_util *)(ulong)this->addrTo,type_00);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    lVar7 = *(long *)(std::cout + -0x18);
    if ((&DAT_0015b249)[lVar7] == '\0') {
      cVar1 = (code)std::ios::widen((char)lVar7 + 'h');
      QVariant::toString[lVar7] = cVar1;
      (&DAT_0015b249)[lVar7] = 1;
    }
    QVariant::toString[lVar7] = (code)0x30;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    lVar7 = std::cout;
    *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar7 + -0x18)) = 8;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t->\t",4);
    lVar7 = *(long *)(std::cout + -0x18);
    if ((&DAT_0015b249)[lVar7] == '\0') {
      cVar1 = (code)std::ios::widen((char)lVar7 + 'h');
      QVariant::toString[lVar7] = cVar1;
      (&DAT_0015b249)[lVar7] = 1;
    }
    QVariant::toString[lVar7] = (code)0x30;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
    lVar7 = std::cout;
    *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::_Rb_tree_decrement + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(lVar7 + -0x18)) = 8;
    plVar6 = (long *)std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    pcVar8 = "]";
    lVar7 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)plVar6,pcVar8,lVar7);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

void ConvertAddrCommand::execute(CmdParams *params, CmdContext  *context)
{
    Executable *exe = cmd_util::getExeFromContext(context);
    offset_t offset = cmd_util::readOffset(addrFrom);

    offset_t outOffset = exe->convertAddr(offset, addrFrom, addrTo);
    if (outOffset == INVALID_ADDR) {
        std::cout << "[WARNING] This address cannot be mapped" << std::endl;
        return;
    }
    std::cout << "[" << cmd_util::addrTypeToStr(addrFrom) << "]"
    	<< "\t->\t"
    	<< "[" << cmd_util::addrTypeToStr(addrTo) << "]"
    	<< ":\n";
    OUT_PADDED_OFFSET(std::cout, offset);
    std::cout << "\t->\t";
    OUT_PADDED_OFFSET(std::cout, outOffset);
    std::cout << std::endl;
}